

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O2

void __thiscall
jsoncons::jsonpath::
parameter<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>::
parameter<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
          (parameter<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>
           *this,value_or_pointer<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *data)

{
  parameter<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>> pVar1;
  anon_union_16_2_320d77ee_for_value_or_pointer<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_3
  *other;
  parameter<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>> *this_00;
  
  *this = (parameter<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>)0x0
  ;
  this_00 = this + 8;
  *(undefined8 *)(this + 8) = 0;
  pVar1 = (parameter<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>)
          data->is_value_;
  *this = pVar1;
  other = &data->field_1;
  if (pVar1 != (parameter<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>
                )0x1) {
    *(pointer *)this_00 = other->ptr_;
    return;
  }
  if (this_00 !=
      (parameter<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>> *)other
     ) {
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::move_assignment
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this_00,
               &other->val_);
  }
  return;
}

Assistant:

parameter(value_or_pointer<Json,JsonReference>&& data) noexcept
        {
            data_.is_value_ = data.is_value_;
            if (data.is_value_)
            {
                data_.val_ = std::move(data.val_);
            }
            else
            {
                data_.ptr_ = data.ptr_;
            }
        }